

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

RefNode * __thiscall RefTable::Add(RefTable *this,SQHash mainpos,SQObject *obj)

{
  long in_RSI;
  long in_RDI;
  RefNode *newnode;
  RefNode *t;
  RefNode *obj_00;
  RefNode *this_00;
  
  this_00 = *(RefNode **)(*(long *)(in_RDI + 0x20) + in_RSI * 8);
  obj_00 = *(RefNode **)(in_RDI + 0x18);
  ::SQObjectPtr::operator=(&this_00->obj,(SQObject *)obj_00);
  *(RefNode **)(*(long *)(in_RDI + 0x20) + in_RSI * 8) = obj_00;
  *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x18);
  obj_00->next = this_00;
  *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 1;
  return obj_00;
}

Assistant:

RefTable::RefNode *RefTable::Add(SQHash mainpos,SQObject &obj)
{
    RefNode *t = _buckets[mainpos];
    RefNode *newnode = _freelist;
    newnode->obj = obj;
    _buckets[mainpos] = newnode;
    _freelist = _freelist->next;
    newnode->next = t;
    assert(newnode->refs == 0);
    _slotused++;
    return newnode;
}